

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::flipcertify
          (tetgenmesh *this,triface *chkface,badface **pqueue,point plane_pa,point plane_pb,
          point plane_pc)

{
  uint uVar1;
  uint uVar2;
  tetrahedron *pppdVar3;
  tetrahedron pb;
  tetrahedron pa;
  tetrahedron pc;
  tetrahedron pd;
  tetrahedron pe;
  badface *pbVar4;
  badface *pbVar5;
  int iVar6;
  badface *pbVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  tetgenmesh *this_00;
  double dVar11;
  double w [5];
  point p [5];
  double local_a8 [6];
  tetrahedron local_78 [6];
  double local_48;
  
  pppdVar3 = chkface->tet;
  uVar1 = chkface->ver;
  pb = pppdVar3[orgpivot[(int)uVar1]];
  local_78[0] = pb;
  pa = pppdVar3[destpivot[(int)uVar1]];
  local_78[1] = pa;
  pc = pppdVar3[apexpivot[(int)uVar1]];
  local_78[2] = pc;
  pd = pppdVar3[oppopivot[(int)uVar1]];
  local_78[3] = pd;
  pe = *(tetrahedron *)
        (((ulong)pppdVar3[uVar1 & 3] & 0xfffffffffffffff0) +
        (long)oppopivot[fsymtbl[(int)uVar1][(uint)pppdVar3[uVar1 & 3] & 0xf]] * 8);
  local_78[4] = pe;
  lVar8 = (long)this->pointmarkindex;
  lVar10 = 0;
  iVar6 = 0;
  iVar9 = 0;
  do {
    uVar2 = *(uint *)((long)local_78[lVar10] + lVar8 * 4 + 4);
    iVar9 = iVar9 + (uint)((uVar2 >> 2 & 1) != 0);
    iVar6 = iVar6 + (uint)((uVar2 >> 3 & 1) != 0);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  this_00 = (tetgenmesh *)(ulong)(iVar9 == 0);
  if (iVar6 == 0 || iVar9 == 0) {
    lVar10 = 0;
    do {
      uVar2 = *(uint *)((long)local_78[lVar10 + 3] + lVar8 * 4 + 4);
      iVar9 = iVar9 + (uint)((uVar2 >> 2 & 1) != 0);
      iVar6 = iVar6 + (uint)((uVar2 >> 3 & 1) != 0);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 2);
    if ((iVar9 != 0) && (iVar6 != 0)) {
      return;
    }
    if (pd == (tetrahedron)this->dummypoint) {
      return;
    }
    if (pe == (tetrahedron)this->dummypoint) {
      return;
    }
    if ((pppdVar3[9] != (tetrahedron)0x0) && ((double *)0x7 < pppdVar3[9][uVar1 & 3])) {
      return;
    }
    dVar11 = insphere_s(this,(double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    if (dVar11 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar8 = (long)this->pointmarkindex;
      printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n",
             (ulong)*(uint *)((long)pb + lVar8 * 4),(ulong)*(uint *)((long)pa + lVar8 * 4),
             (ulong)*(uint *)((long)pc + lVar8 * 4),(ulong)*(uint *)((long)pd + lVar8 * 4),
             (ulong)*(uint *)((long)pe + lVar8 * 4));
    }
    pbVar4 = (badface *)memorypool::alloc(this->flippool);
    pbVar4->key = 0.0;
    (pbVar4->tt).tet = chkface->tet;
    (pbVar4->tt).ver = chkface->ver;
    pbVar4->forg = (point)pb;
    pbVar4->fdest = (point)pa;
    pbVar4->fapex = (point)pc;
    pbVar4->foppo = (point)pd;
    pbVar4->noppo = (point)pe;
    if (*pqueue != (badface *)0x0) {
      pbVar4->nextitem = *pqueue;
      *pqueue = pbVar4;
      return;
    }
    *pqueue = pbVar4;
  }
  else {
    lVar10 = 0;
    do {
      if ((*(byte *)((long)local_78[lVar10] + lVar8 * 4 + 4) & 4) == 0) {
        local_a8[lVar10] = 0.0;
      }
      else {
        dVar11 = orient3dfast(this_00,plane_pa,plane_pb,plane_pc,(double *)local_78[lVar10]);
        local_a8[lVar10] = dVar11;
        if (dVar11 < 0.0) {
          local_a8[lVar10] = -dVar11;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    local_48 = insphere((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe);
    dVar11 = orient4d((double *)pa,(double *)pb,(double *)pc,(double *)pd,(double *)pe,local_a8[1],
                      local_a8[0],local_a8[2],local_a8[3],local_a8[4]);
    if (dVar11 <= 0.0) {
      return;
    }
    if (2 < this->b->verbose) {
      lVar8 = (long)this->pointmarkindex;
      printf("      Insert face (%d, %d, %d) - %d, %d\n",(ulong)*(uint *)((long)pb + lVar8 * 4),
             (ulong)*(uint *)((long)pa + lVar8 * 4),(ulong)*(uint *)((long)pc + lVar8 * 4),
             (ulong)*(uint *)((long)pd + lVar8 * 4),(ulong)*(uint *)((long)pe + lVar8 * 4));
    }
    pbVar4 = (badface *)memorypool::alloc(this->flippool);
    dVar11 = -local_48 / dVar11;
    pbVar4->key = dVar11;
    (pbVar4->tt).tet = chkface->tet;
    (pbVar4->tt).ver = chkface->ver;
    pbVar4->forg = (point)pb;
    pbVar4->fdest = (point)pa;
    pbVar4->fapex = (point)pc;
    pbVar4->foppo = (point)pd;
    pbVar4->noppo = (point)pe;
    pbVar5 = *pqueue;
    if (pbVar5 != (badface *)0x0) {
      if (dVar11 < pbVar5->key || dVar11 == pbVar5->key) {
        pbVar7 = (badface *)0x0;
      }
      else {
        do {
          pbVar7 = pbVar5;
          pbVar5 = pbVar7->nextitem;
          if (pbVar5 == (badface *)0x0) {
            pbVar5 = (badface *)0x0;
            goto LAB_001311c1;
          }
        } while (pbVar5->key <= dVar11 && dVar11 != pbVar5->key);
      }
      if (pbVar7 != (badface *)0x0) {
LAB_001311c1:
        pqueue = &pbVar7->nextitem;
      }
      *pqueue = pbVar4;
      pbVar4->nextitem = pbVar5;
      return;
    }
    *pqueue = pbVar4;
  }
  pbVar4->nextitem = (badface *)0x0;
  return;
}

Assistant:

void tetgenmesh::flipcertify(triface *chkface,badface **pqueue,point plane_pa,
                             point plane_pb, point plane_pc)
{
  badface *parybf, *prevbf, *nextbf;
  triface neightet;
  face checksh;
  point p[5];
  REAL w[5];
  REAL insph, ori4;
  int topi, boti;
  int i;

  // Compute the flip time \tau.
  fsym(*chkface, neightet);

  p[0] = org(*chkface);
  p[1] = dest(*chkface);
  p[2] = apex(*chkface);
  p[3] = oppo(*chkface);
  p[4] = oppo(neightet);

  // Check if the face is a crossing face.
  topi = boti = 0;
  for (i = 0; i < 3; i++) {
    if (pmarktest2ed(p[i])) topi++;
    if (pmarktest3ed(p[i])) boti++;
  }
  if ((topi == 0) || (boti == 0)) {
    // It is not a crossing face.
    // return;
    for (i = 3; i < 5; i++) {
      if (pmarktest2ed(p[i])) topi++;
      if (pmarktest3ed(p[i])) boti++;
    }
    if ((topi == 0) || (boti == 0)) {
      // The two tets sharing at this face are on one side of the facet.
      // Check if this face is locally Delaunay (due to rounding error).
      if ((p[3] != dummypoint) && (p[4] != dummypoint)) {
        // Do not check it if it is a subface.
        tspivot(*chkface, checksh);
        if (checksh.sh == NULL) {
          insph = insphere_s(p[1], p[0], p[2], p[3], p[4]);
          if (insph > 0) {
            // Add the face into queue.
            if (b->verbose > 2) {
              printf("      A locally non-Delanay face (%d, %d, %d)-%d,%d\n", 
                     pointmark(p[0]), pointmark(p[1]), pointmark(p[2]), 
                     pointmark(p[3]), pointmark(p[4]));
            }
            parybf = (badface *) flippool->alloc();
            parybf->key = 0.;  // tau = 0, do immediately.
            parybf->tt = *chkface;
            parybf->forg = p[0];
            parybf->fdest = p[1];
            parybf->fapex = p[2];
            parybf->foppo = p[3];
            parybf->noppo = p[4];
            // Add it at the top of the priority queue.
            if (*pqueue == NULL) {
              *pqueue = parybf;
              parybf->nextitem = NULL;
            } else {
              parybf->nextitem = *pqueue;
              *pqueue = parybf;
            }
          } // if (insph > 0)
        } // if (checksh.sh == NULL)
      }
    }
    return; // Test: omit this face.
  }

  // Decide the "height" for each point.
  for (i = 0; i < 5; i++) {
    if (pmarktest2ed(p[i])) {
      // A top point has a positive weight.
      w[i] = orient3dfast(plane_pa, plane_pb, plane_pc, p[i]);      
      if (w[i] < 0) w[i] = -w[i];
    } else {
      w[i] = 0;
    }
  }

  insph = insphere(p[1], p[0], p[2], p[3], p[4]);
  ori4 = orient4d(p[1], p[0], p[2], p[3], p[4], w[1], w[0], w[2], w[3], w[4]);
  if (ori4 > 0) {
    // Add the face into queue.
    if (b->verbose > 2) {
      printf("      Insert face (%d, %d, %d) - %d, %d\n", pointmark(p[0]),
        pointmark(p[1]), pointmark(p[2]), pointmark(p[3]), pointmark(p[4]));
    }
    
    parybf = (badface *) flippool->alloc();

    parybf->key = -insph / ori4;
    parybf->tt = *chkface;
    parybf->forg = p[0];
    parybf->fdest = p[1];
    parybf->fapex = p[2];
    parybf->foppo = p[3];
    parybf->noppo = p[4];

    // Push the face into priority queue.
    //pq.push(bface);
    if (*pqueue == NULL) {
      *pqueue = parybf;
      parybf->nextitem = NULL;
    } else {
      // Search an item whose key is larger or equal to current key.
      prevbf = NULL;
      nextbf = *pqueue;
      //if (!b->flipinsert_random) { // Default use a priority queue.
        // Insert the item into priority queue.
        while (nextbf != NULL) {
          if (nextbf->key < parybf->key) {
            prevbf = nextbf;
            nextbf = nextbf->nextitem;
          } else {
            break;
          }
        }
      //} // if (!b->flipinsert_random)
      // Insert the new item between prev and next items.
      if (prevbf == NULL) {
        *pqueue = parybf;
      } else {
        prevbf->nextitem = parybf;
      }
      parybf->nextitem = nextbf;
    }
  } else if (ori4 == 0) {
    
  }
}